

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::CheckOutSourceDir(cmCTestScriptHandler *this)

{
  OutputOption outputflag;
  cmCTest *this_00;
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  rep_conflict local_210;
  string local_208 [32];
  undefined1 local_1e8 [8];
  ostringstream cmCTestLog_msg;
  int local_5c;
  undefined1 local_58 [3];
  bool res;
  int retVal;
  string output;
  string command;
  cmCTestScriptHandler *this_local;
  
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
  bVar1 = cmsys::SystemTools::FileExists(&this->SourceDir);
  if ((!bVar1) && (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
    std::__cxx11::string::clear();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
    poVar3 = std::operator<<((ostream *)local_1e8,"Run cvs: ");
    poVar3 = std::operator<<(poVar3,(string *)&this->CVSCheckOut);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_00 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(this_00,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0x241,pcVar4,false);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    outputflag = (this->super_cmCTestGenericHandler).HandlerVerbose;
    local_210 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    bVar1 = cmSystemTools::RunSingleCommand
                      (&this->CVSCheckOut,(string *)local_58,(string *)local_58,&local_5c,pcVar4,
                       outputflag,(cmDuration)local_210);
    if ((!bVar1) || (local_5c != 0)) {
      std::operator+(&local_230,"Unable to perform cvs checkout:\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      cmSystemTools::Error(&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      this_local._4_4_ = 6;
      goto LAB_009f3f0e;
    }
  }
  this_local._4_4_ = 0;
LAB_009f3f0e:
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  return this_local._4_4_;
}

Assistant:

int cmCTestScriptHandler::CheckOutSourceDir()
{
  std::string command;
  std::string output;
  int retVal;
  bool res;

  if (!cmSystemTools::FileExists(this->SourceDir) &&
      !this->CVSCheckOut.empty()) {
    // we must now checkout the src dir
    output.clear();
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Run cvs: " << this->CVSCheckOut << std::endl);
    res = cmSystemTools::RunSingleCommand(
      this->CVSCheckOut, &output, &output, &retVal, this->CTestRoot.c_str(),
      this->HandlerVerbose, cmDuration::zero() /*this->TimeOut*/);
    if (!res || retVal != 0) {
      cmSystemTools::Error("Unable to perform cvs checkout:\n" + output);
      return 6;
    }
  }
  return 0;
}